

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::ConvertCluster
          (FBXConverter *this,vector<aiBone_*,_std::allocator<aiBone_*>_> *param_1,Cluster *cl,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *index_out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *count_out_indices,
          aiMatrix4x4 *absolute_transform,aiNode *parent,aiNode *root_node)

{
  char *__dest;
  pointer puVar1;
  pointer puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  size_type sVar18;
  Logger *pLVar19;
  mapped_type *ppaVar20;
  aiBone *this_00;
  ulong uVar21;
  aiVertexWeight *__s;
  unsigned_long uVar22;
  aiMatrix4x4 *this_01;
  FBXConverter *this_02;
  unsigned_long uVar23;
  ulong uVar24;
  size_t __n;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
  *this_03;
  long lVar25;
  bool bVar26;
  mapped_type local_640;
  aiMatrix4x4t<float> temp;
  string deformer_name;
  aiMatrix4x4 matrix;
  aiString bone_name;
  
  if (cl != (Cluster *)0x0) {
    this_02 = (FBXConverter *)&(cl->node->super_Object).name;
    std::__cxx11::string::string((string *)&deformer_name,(string *)this_02);
    FixNodeName((string *)&matrix,this_02,&deformer_name);
    __n = 0x3ff;
    if ((matrix._8_8_ & 0xfffffc00) == 0) {
      __n = matrix._8_8_ & 0xffffffff;
    }
    __dest = bone_name.data;
    bone_name.length = (ai_uint32)__n;
    memcpy(__dest,(void *)matrix._0_8_,__n);
    bone_name.data[__n] = '\0';
    std::__cxx11::string::~string((string *)&matrix);
    this_03 = &this->bone_map;
    sVar18 = std::
             map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
             ::count(this_03,&deformer_name);
    if (sVar18 == 0) {
      pLVar19 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[18]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&matrix,
                 (char (*) [18])"created new bone ");
      std::operator<<((ostream *)&matrix,__dest);
      std::operator<<((ostream *)&matrix,". Deformer: ");
      std::operator<<((ostream *)&matrix,(string *)&deformer_name);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar19,(char *)temp._0_8_);
      std::__cxx11::string::~string((string *)&temp);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&matrix);
      this_00 = (aiBone *)operator_new(0x460);
      aiBone::aiBone(this_00);
      uVar24 = (ulong)bone_name.length;
      (this_00->mName).length = bone_name.length;
      local_640 = this_00;
      memcpy((this_00->mName).data,__dest,uVar24);
      (this_00->mName).data[uVar24] = '\0';
      this_01 = &this_00->mOffsetMatrix;
      fVar3 = (cl->transformLink).a2;
      fVar4 = (cl->transformLink).a3;
      fVar5 = (cl->transformLink).a4;
      fVar6 = (cl->transformLink).b1;
      fVar7 = (cl->transformLink).b2;
      fVar8 = (cl->transformLink).b3;
      fVar9 = (cl->transformLink).b4;
      fVar10 = (cl->transformLink).c1;
      fVar11 = (cl->transformLink).c2;
      fVar12 = (cl->transformLink).c3;
      fVar13 = (cl->transformLink).c4;
      fVar14 = (cl->transformLink).d1;
      fVar15 = (cl->transformLink).d2;
      fVar16 = (cl->transformLink).d3;
      fVar17 = (cl->transformLink).d4;
      (this_00->mOffsetMatrix).a1 = (cl->transformLink).a1;
      (this_00->mOffsetMatrix).a2 = fVar3;
      (this_00->mOffsetMatrix).a3 = fVar4;
      (this_00->mOffsetMatrix).a4 = fVar5;
      (this_00->mOffsetMatrix).b1 = fVar6;
      (this_00->mOffsetMatrix).b2 = fVar7;
      (this_00->mOffsetMatrix).b3 = fVar8;
      (this_00->mOffsetMatrix).b4 = fVar9;
      (this_00->mOffsetMatrix).c1 = fVar10;
      (this_00->mOffsetMatrix).c2 = fVar11;
      (this_00->mOffsetMatrix).c3 = fVar12;
      (this_00->mOffsetMatrix).c4 = fVar13;
      (this_00->mOffsetMatrix).d1 = fVar14;
      (this_00->mOffsetMatrix).d2 = fVar15;
      (this_00->mOffsetMatrix).d3 = fVar16;
      (this_00->mOffsetMatrix).d4 = fVar17;
      aiMatrix4x4t<float>::Inverse(this_01);
      matrix.a1 = absolute_transform->a1;
      matrix.a2 = absolute_transform->a2;
      matrix.a3 = absolute_transform->a3;
      matrix.a4 = absolute_transform->a4;
      matrix.b1 = absolute_transform->b1;
      matrix.b2 = absolute_transform->b2;
      matrix.b3 = absolute_transform->b3;
      matrix.b4 = absolute_transform->b4;
      matrix.c1 = absolute_transform->c1;
      matrix.c2 = absolute_transform->c2;
      matrix.c3 = absolute_transform->c3;
      matrix.c4 = absolute_transform->c4;
      matrix.d1 = absolute_transform->d1;
      matrix.d2 = absolute_transform->d2;
      matrix.d3 = absolute_transform->d3;
      matrix.d4 = absolute_transform->d4;
      temp.a1 = this_01->a1;
      temp.a2 = this_01->a2;
      temp.a3 = (this_00->mOffsetMatrix).a3;
      temp.a4 = (this_00->mOffsetMatrix).a4;
      temp.b1 = (this_00->mOffsetMatrix).b1;
      temp.b2 = (this_00->mOffsetMatrix).b2;
      temp.b3 = (this_00->mOffsetMatrix).b3;
      temp.b4 = (this_00->mOffsetMatrix).b4;
      temp.c1 = (this_00->mOffsetMatrix).c1;
      temp.c2 = (this_00->mOffsetMatrix).c2;
      temp.c3 = (this_00->mOffsetMatrix).c3;
      temp.c4 = (this_00->mOffsetMatrix).c4;
      temp.d1 = (this_00->mOffsetMatrix).d1;
      temp.d2 = (this_00->mOffsetMatrix).d2;
      temp.d3 = (this_00->mOffsetMatrix).d3;
      temp.d4 = (this_00->mOffsetMatrix).d4;
      aiMatrix4x4t<float>::operator*=(&temp,&matrix);
      (this_00->mOffsetMatrix).d1 = temp.d1;
      (this_00->mOffsetMatrix).d2 = temp.d2;
      (this_00->mOffsetMatrix).d3 = temp.d3;
      (this_00->mOffsetMatrix).d4 = temp.d4;
      (this_00->mOffsetMatrix).c1 = temp.c1;
      (this_00->mOffsetMatrix).c2 = temp.c2;
      (this_00->mOffsetMatrix).c3 = temp.c3;
      (this_00->mOffsetMatrix).c4 = temp.c4;
      (this_00->mOffsetMatrix).b1 = temp.b1;
      (this_00->mOffsetMatrix).b2 = temp.b2;
      (this_00->mOffsetMatrix).b3 = temp.b3;
      (this_00->mOffsetMatrix).b4 = temp.b4;
      this_01->a1 = temp.a1;
      this_01->a2 = temp.a2;
      (this_00->mOffsetMatrix).a3 = temp.a3;
      (this_00->mOffsetMatrix).a4 = temp.a4;
      puVar1 = (out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      uVar21 = (long)puVar2 - (long)puVar1;
      this_00->mNumWeights = (uint)(uVar21 >> 3);
      uVar24 = 0xffffffffffffffff;
      if (-1 < (long)uVar21) {
        uVar24 = uVar21;
      }
      __s = (aiVertexWeight *)operator_new__(uVar24);
      lVar25 = (long)puVar2 - (long)puVar1;
      if (lVar25 != 0) {
        memset(__s,0,(lVar25 - 8U & 0xfffffffffffffff8) + 8);
      }
      this_00->mWeights = __s;
      puVar1 = (index_out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      puVar2 = (index_out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (lVar25 = 0; lVar25 != (long)puVar1 - (long)puVar2 >> 3; lVar25 = lVar25 + 1) {
        uVar22 = (index_out_indices->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar25];
        if (uVar22 != 0xffffffffffffffff) {
          uVar23 = (count_out_indices->
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar25];
          while (bVar26 = uVar23 != 0, uVar23 = uVar23 - 1, bVar26) {
            __s->mVertexId =
                 (uint)(out_indices->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar22];
            __s->mWeight = (cl->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar25];
            __s = __s + 1;
            uVar22 = uVar22 + 1;
          }
        }
      }
      std::__cxx11::string::string((string *)&temp,(string *)&deformer_name);
      temp._32_8_ = local_640;
      std::
      _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,aiBone*>,std::_Select1st<std::pair<std::__cxx11::string_const,aiBone*>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,aiBone*>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,aiBone*>>
                ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,aiBone*>,std::_Select1st<std::pair<std::__cxx11::string_const,aiBone*>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,aiBone*>>>
                  *)this_03,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>
                  *)&temp);
      std::__cxx11::string::~string((string *)&temp);
    }
    else {
      pLVar19 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[28]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&matrix,
                 (char (*) [28])"retrieved bone from lookup ");
      std::operator<<((ostream *)&matrix,__dest);
      std::operator<<((ostream *)&matrix,". Deformer:");
      std::operator<<((ostream *)&matrix,(string *)&deformer_name);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar19,(char *)temp._0_8_);
      std::__cxx11::string::~string((string *)&temp);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&matrix);
      ppaVar20 = std::
                 map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
                 ::operator[](this_03,&deformer_name);
      local_640 = *ppaVar20;
    }
    pLVar19 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[31]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&matrix,
               (char (*) [31])"bone research: Indicies size: ");
    std::ostream::_M_insert<unsigned_long>((ulong)&matrix);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar19,(char *)temp._0_8_);
    std::__cxx11::string::~string((string *)&temp);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&matrix);
    std::vector<aiBone_*,_std::allocator<aiBone_*>_>::push_back(param_1,&local_640);
    std::__cxx11::string::~string((string *)&deformer_name);
    return;
  }
  __assert_fail("cl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                ,0x63b,
                "void Assimp::FBX::FBXConverter::ConvertCluster(std::vector<aiBone *> &, const Cluster *, std::vector<size_t> &, std::vector<size_t> &, std::vector<size_t> &, const aiMatrix4x4 &, aiNode *, aiNode *)"
               );
}

Assistant:

void FBXConverter::ConvertCluster(std::vector<aiBone *> &local_mesh_bones, const Cluster *cl,
                                          std::vector<size_t> &out_indices, std::vector<size_t> &index_out_indices,
                                          std::vector<size_t> &count_out_indices, const aiMatrix4x4 &absolute_transform,
                                          aiNode *parent, aiNode *root_node) {
            ai_assert(cl); // make sure cluster valid
            std::string deformer_name = cl->TargetNode()->Name();
            aiString bone_name = aiString(FixNodeName(deformer_name));

            aiBone *bone = nullptr;

            if (bone_map.count(deformer_name)) {
				ASSIMP_LOG_DEBUG_F("retrieved bone from lookup ", bone_name.C_Str(), ". Deformer:", deformer_name);
				bone = bone_map[deformer_name];
			} else {
				ASSIMP_LOG_DEBUG_F("created new bone ", bone_name.C_Str(), ". Deformer: ", deformer_name);
				bone = new aiBone();
                bone->mName = bone_name;

                // store local transform link for post processing
                bone->mOffsetMatrix = cl->TransformLink();
                bone->mOffsetMatrix.Inverse();

                aiMatrix4x4 matrix = (aiMatrix4x4)absolute_transform;

                bone->mOffsetMatrix = bone->mOffsetMatrix * matrix; // * mesh_offset


                //
                // Now calculate the aiVertexWeights
                //

                aiVertexWeight *cursor = nullptr;

                bone->mNumWeights = static_cast<unsigned int>(out_indices.size());
                cursor = bone->mWeights = new aiVertexWeight[out_indices.size()];

                const size_t no_index_sentinel = std::numeric_limits<size_t>::max();
                const WeightArray& weights = cl->GetWeights();

                const size_t c = index_out_indices.size();
                for (size_t i = 0; i < c; ++i) {
                    const size_t index_index = index_out_indices[i];

                    if (index_index == no_index_sentinel) {
                        continue;
                    }

                    const size_t cc = count_out_indices[i];
                    for (size_t j = 0; j < cc; ++j) {
                        // cursor runs from first element relative to the start
                        // or relative to the start of the next indexes.
                        aiVertexWeight& out_weight = *cursor++;

                        out_weight.mVertexId = static_cast<unsigned int>(out_indices[index_index + j]);
                        out_weight.mWeight = weights[i];
                    }
                }

                bone_map.insert(std::pair<const std::string, aiBone *>(deformer_name, bone));
            }

            ASSIMP_LOG_DEBUG_F("bone research: Indicies size: ", out_indices.size());

            // lookup must be populated in case something goes wrong
            // this also allocates bones to mesh instance outside
            local_mesh_bones.push_back(bone);
        }